

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::SplitProgramPath(string *in_name,string *dir,string *file,bool param_4)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_98 [8];
  string oldDir;
  string local_58 [32];
  long local_38;
  size_type slashPos;
  string *psStack_28;
  bool param_3_local;
  string *file_local;
  string *dir_local;
  string *in_name_local;
  
  slashPos._7_1_ = param_4;
  psStack_28 = file;
  file_local = dir;
  dir_local = in_name;
  std::__cxx11::string::operator=((string *)dir,(string *)in_name);
  std::__cxx11::string::operator=((string *)psStack_28,"");
  ConvertToUnixSlashes(file_local);
  bVar1 = FileIsDirectory(file_local);
  if (!bVar1) {
    local_38 = std::__cxx11::string::rfind((char *)file_local,0x7b7b95);
    if (local_38 == -1) {
      std::__cxx11::string::operator=((string *)psStack_28,(string *)file_local);
      std::__cxx11::string::operator=((string *)file_local,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_58,(ulong)file_local);
      std::__cxx11::string::operator=((string *)psStack_28,local_58);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::substr((ulong)((long)&oldDir.field_2 + 8),(ulong)file_local);
      std::__cxx11::string::operator=
                ((string *)file_local,(string *)(oldDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(oldDir.field_2._M_local_buf + 8));
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (bVar1 = FileIsDirectory(file_local), bVar1)) {
    in_name_local._7_1_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_98,(string *)dir_local);
    ConvertToUnixSlashes((string *)local_98);
    std::__cxx11::string::operator=((string *)file_local,(string *)dir_local);
    in_name_local._7_1_ = 0;
    std::__cxx11::string::~string((string *)local_98);
  }
  return (bool)(in_name_local._7_1_ & 1);
}

Assistant:

bool SystemTools::SplitProgramPath(const std::string& in_name,
                                   std::string& dir, std::string& file, bool)
{
  dir = in_name;
  file = "";
  SystemTools::ConvertToUnixSlashes(dir);

  if (!SystemTools::FileIsDirectory(dir)) {
    std::string::size_type slashPos = dir.rfind("/");
    if (slashPos != std::string::npos) {
      file = dir.substr(slashPos + 1);
      dir = dir.substr(0, slashPos);
    } else {
      file = dir;
      dir = "";
    }
  }
  if (!(dir.empty()) && !SystemTools::FileIsDirectory(dir)) {
    std::string oldDir = in_name;
    SystemTools::ConvertToUnixSlashes(oldDir);
    dir = in_name;
    return false;
  }
  return true;
}